

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser.h
# Opt level: O3

filtered_directed_graph_t *
read_graph_flagser(filtered_directed_graph_t *__return_storage_ptr__,string *filename,
                  flagser_parameters *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pcVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pfVar7;
  pointer pfVar8;
  pointer puVar9;
  pointer puVar10;
  pointer **pppuVar11;
  char cVar12;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar13;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  long *plVar15;
  ulong uVar16;
  runtime_error *this;
  size_type *psVar17;
  pointer **pppuVar18;
  int iVar19;
  size_type sVar20;
  int iVar21;
  float fVar22;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vertices;
  string line;
  vector<float,_std::allocator<float>_> vertices_1;
  string err_msg;
  ifstream input_stream;
  filtered_directed_graph_t *local_578;
  int local_570;
  uint local_56c;
  vector<float,_std::allocator<float>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  string local_528;
  vector<float,_std::allocator<float>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  filtered_directed_graph_t local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  flagser_parameters *local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  vector<float,_std::allocator<float>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_528._M_string_length = 0;
  local_528.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).directed = true;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_578 = __return_storage_ptr__;
  local_398 = params;
  std::ifstream::ifstream(local_238);
  pcVar4 = (filename->_M_dataplus)._M_p;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,pcVar4,pcVar4 + filename->_M_string_length);
  open_file(&local_370,(ifstream *)local_238);
  uVar13 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    uVar13 = extraout_RAX_00;
  }
  pppuVar11 = (pointer **)
              &local_4d0.super_directed_graph_t.edges.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_570 = 0;
  local_56c = (uint)CONCAT71((int7)((ulong)uVar13 >> 8),1);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
              std::ifstream::~ifstream(local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_568.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_568.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_528._M_dataplus._M_p != &local_528.field_2) {
                operator_delete(local_528._M_dataplus._M_p,
                                CONCAT71(local_528.field_2._M_allocated_capacity._1_7_,
                                         local_528.field_2._M_local_buf[0]) + 1);
              }
              return local_578;
            }
            cVar12 = std::ios::widen((char)&local_578 + (char)*(long *)(local_238[0] + -0x18) + '@')
            ;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_528,cVar12);
            _Var14 = std::
                     __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<trim(std::__cxx11::string_const&)::_lambda(int)_1_>>
                               (local_528._M_dataplus._M_p,
                                local_528._M_dataplus._M_p + local_528._M_string_length);
            local_548._M_dataplus._M_p = local_528._M_dataplus._M_p + local_528._M_string_length;
            local_4f0._M_dataplus._M_p = local_528._M_dataplus._M_p;
            std::
            __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_negate<trim(std::__cxx11::string_const&)::_lambda(int)_2_>>
                      (&local_390,&local_548,&local_4f0);
            local_4d0.super_directed_graph_t._0_8_ = pppuVar11;
            if (_Var14._M_current < local_390._M_dataplus._M_p) {
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_4d0,_Var14._M_current);
            }
            else {
              local_4d0.super_directed_graph_t.edges.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_4d0.super_directed_graph_t.edges.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((ulong)local_4d0.super_directed_graph_t.edges.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00)
              ;
            }
            std::__cxx11::string::operator=((string *)&local_528,(string *)&local_4d0);
            if ((pointer **)local_4d0.super_directed_graph_t._0_8_ != pppuVar11) {
              operator_delete((void *)local_4d0.super_directed_graph_t._0_8_,
                              (ulong)((long)local_4d0.super_directed_graph_t.edges.
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + 1));
            }
          } while (local_528._M_string_length == 0);
          if (((*local_528._M_dataplus._M_p != 'd') || (local_528._M_dataplus._M_p[1] != 'i')) ||
             (local_528._M_dataplus._M_p[2] != 'm')) break;
          if (local_528._M_dataplus._M_p[4] == '1') {
            std::vector<float,_std::allocator<float>_>::vector(&local_350,&local_568);
            filtered_directed_graph_t::filtered_directed_graph_t
                      (&local_4d0,&local_350,local_398->directed);
            (local_578->super_directed_graph_t).number_of_vertices =
                 local_4d0.super_directed_graph_t.number_of_vertices;
            puVar5 = (local_578->super_directed_graph_t).edges.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar6 = (local_578->super_directed_graph_t).edges.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            (local_578->super_directed_graph_t).edges.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_4d0.super_directed_graph_t.edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (local_578->super_directed_graph_t).edges.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_4d0.super_directed_graph_t.edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (local_578->super_directed_graph_t).edges.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_4d0.super_directed_graph_t.edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_4d0.super_directed_graph_t.edges.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4d0.super_directed_graph_t.edges.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4d0.super_directed_graph_t.edges.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar5 != (pointer)0x0) {
              operator_delete(puVar5,(long)puVar6 - (long)puVar5);
            }
            pfVar7 = (local_578->super_directed_graph_t).edge_filtration.
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar8 = (local_578->super_directed_graph_t).edge_filtration.
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            (local_578->super_directed_graph_t).edge_filtration.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = local_4d0.super_directed_graph_t.edge_filtration.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
            (local_578->super_directed_graph_t).edge_filtration.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_4d0.super_directed_graph_t.edge_filtration.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            (local_578->super_directed_graph_t).edge_filtration.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 local_4d0.super_directed_graph_t.edge_filtration.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
            local_4d0.super_directed_graph_t.edge_filtration.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_4d0.super_directed_graph_t.edge_filtration.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_4d0.super_directed_graph_t.edge_filtration.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            if (pfVar7 != (pointer)0x0) {
              operator_delete(pfVar7,(long)pfVar8 - (long)pfVar7);
            }
            puVar9 = (local_578->super_directed_graph_t).outdegrees.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar10 = (local_578->super_directed_graph_t).outdegrees.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            (local_578->super_directed_graph_t).outdegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_4d0.super_directed_graph_t.outdegrees.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (local_578->super_directed_graph_t).outdegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_4d0.super_directed_graph_t.outdegrees.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (local_578->super_directed_graph_t).outdegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_4d0.super_directed_graph_t.outdegrees.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_4d0.super_directed_graph_t.outdegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4d0.super_directed_graph_t.outdegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4d0.super_directed_graph_t.outdegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar9 != (pointer)0x0) {
              operator_delete(puVar9,(long)puVar10 - (long)puVar9);
            }
            puVar9 = (local_578->super_directed_graph_t).indegrees.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar10 = (local_578->super_directed_graph_t).indegrees.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            (local_578->super_directed_graph_t).indegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_4d0.super_directed_graph_t.indegrees.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (local_578->super_directed_graph_t).indegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_4d0.super_directed_graph_t.indegrees.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (local_578->super_directed_graph_t).indegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_4d0.super_directed_graph_t.indegrees.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_4d0.super_directed_graph_t.indegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4d0.super_directed_graph_t.indegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4d0.super_directed_graph_t.indegrees.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar9 != (pointer)0x0) {
              operator_delete(puVar9,(long)puVar10 - (long)puVar9);
            }
            (local_578->super_directed_graph_t).directed = local_4d0.super_directed_graph_t.directed
            ;
            puVar9 = (local_578->super_directed_graph_t).incidence_incoming.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar10 = (local_578->super_directed_graph_t).incidence_incoming.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            (local_578->super_directed_graph_t).incidence_incoming.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_4d0.super_directed_graph_t.incidence_incoming.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (local_578->super_directed_graph_t).incidence_incoming.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_4d0.super_directed_graph_t.incidence_incoming.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (local_578->super_directed_graph_t).incidence_incoming.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_4d0.super_directed_graph_t.incidence_incoming.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_4d0.super_directed_graph_t.incidence_incoming.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4d0.super_directed_graph_t.incidence_incoming.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4d0.super_directed_graph_t.incidence_incoming.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar9 != (pointer)0x0) {
              operator_delete(puVar9,(long)puVar10 - (long)puVar9);
            }
            puVar9 = (local_578->super_directed_graph_t).incidence_outgoing.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar10 = (local_578->super_directed_graph_t).incidence_outgoing.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            (local_578->super_directed_graph_t).incidence_outgoing.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_4d0.super_directed_graph_t.incidence_outgoing.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (local_578->super_directed_graph_t).incidence_outgoing.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_4d0.super_directed_graph_t.incidence_outgoing.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (local_578->super_directed_graph_t).incidence_outgoing.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_4d0.super_directed_graph_t.incidence_outgoing.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_4d0.super_directed_graph_t.incidence_outgoing.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4d0.super_directed_graph_t.incidence_outgoing.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4d0.super_directed_graph_t.incidence_outgoing.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar9 != (pointer)0x0) {
              operator_delete(puVar9,(long)puVar10 - (long)puVar9);
            }
            (local_578->super_directed_graph_t).incidence_row_length =
                 local_4d0.super_directed_graph_t.incidence_row_length;
            pfVar7 = (local_578->vertex_filtration).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar8 = (local_578->vertex_filtration).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            (local_578->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl
            .super__Vector_impl_data._M_start =
                 local_4d0.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (local_578->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 local_4d0.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (local_578->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage =
                 local_4d0.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_4d0.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4d0.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4d0.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (pfVar7 != (pointer)0x0) {
              operator_delete(pfVar7,(long)pfVar8 - (long)pfVar7);
            }
            pfVar7 = (local_578->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pfVar8 = (local_578->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            (local_578->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_4d0.edge_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl
                 .super__Vector_impl_data._M_start;
            (local_578->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_4d0.edge_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            (local_578->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_4d0.edge_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
            local_4d0.edge_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4d0.edge_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4d0.edge_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (pfVar7 != (pointer)0x0) {
              operator_delete(pfVar7,(long)pfVar8 - (long)pfVar7);
              if (local_4d0.edge_filtration.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_4d0.edge_filtration.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_4d0.edge_filtration.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_4d0.edge_filtration.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
            }
            if (local_4d0.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4d0.vertex_filtration.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_4d0.vertex_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_4d0.vertex_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_4d0.super_directed_graph_t.incidence_outgoing.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4d0.super_directed_graph_t.incidence_outgoing.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_4d0.super_directed_graph_t.incidence_outgoing.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_4d0.super_directed_graph_t.incidence_outgoing.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_4d0.super_directed_graph_t.incidence_incoming.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4d0.super_directed_graph_t.incidence_incoming.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_4d0.super_directed_graph_t.incidence_incoming.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_4d0.super_directed_graph_t.incidence_incoming.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_4d0.super_directed_graph_t.indegrees.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4d0.super_directed_graph_t.indegrees.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_4d0.super_directed_graph_t.indegrees.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_4d0.super_directed_graph_t.indegrees.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_4d0.super_directed_graph_t.outdegrees.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4d0.super_directed_graph_t.outdegrees.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_4d0.super_directed_graph_t.outdegrees.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_4d0.super_directed_graph_t.outdegrees.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_4d0.super_directed_graph_t.edge_filtration.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              operator_delete(local_4d0.super_directed_graph_t.edge_filtration.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_4d0.super_directed_graph_t.edge_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_4d0.super_directed_graph_t.edge_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_4d0.super_directed_graph_t.edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4d0.super_directed_graph_t.edges.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_4d0.super_directed_graph_t.edges.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_4d0.super_directed_graph_t.edges.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_350.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_350.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_350.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_350.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            local_570 = 1;
            local_56c = 0;
          }
        }
        if ((local_56c & 1) == 0) break;
        if (local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_4d0.super_directed_graph_t.edges.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_4d0.super_directed_graph_t._0_8_ = string_to_float;
          local_4d0.super_directed_graph_t.edges.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        ::_M_invoke;
          local_4d0.super_directed_graph_t.edges.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)std::
                        _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        ::_M_manager;
          split<float>((vector<float,_std::allocator<float>_> *)&local_548,&local_528,' ',
                       (function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_4d0);
          pfVar8 = local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pfVar7 = local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_548._M_dataplus._M_p;
          local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_548._M_string_length;
          local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_548.field_2._M_allocated_capacity;
          local_548._M_dataplus._M_p = (pointer)0x0;
          local_548._M_string_length = 0;
          local_548.field_2._M_allocated_capacity = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pfVar7 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(pfVar7,(long)pfVar8 - (long)pfVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_548._M_dataplus._M_p,
                              local_548.field_2._M_allocated_capacity -
                              (long)local_548._M_dataplus._M_p);
            }
          }
          if ((code *)local_4d0.super_directed_graph_t.edges.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish != (code *)0x0) {
            (*(code *)local_4d0.super_directed_graph_t.edges.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish)(&local_4d0,&local_4d0,3);
          }
        }
      }
      if (local_570 != 3) break;
LAB_0011414e:
      local_4d0.super_directed_graph_t.edges.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_4d0.super_directed_graph_t._0_8_ = string_to_uint;
      local_4d0.super_directed_graph_t.edges.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Function_handler<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_unsigned_int_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    ::_M_invoke;
      local_4d0.super_directed_graph_t.edges.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)std::
                    _Function_handler<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_unsigned_int_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    ::_M_manager;
      split<unsigned_short>
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_548,&local_528,
                 ' ',(function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)&local_4d0);
      if ((code *)local_4d0.super_directed_graph_t.edges.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish != (code *)0x0) {
        (*(code *)local_4d0.super_directed_graph_t.edges.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish)(&local_4d0,&local_4d0,3);
      }
      directed_graph_t::add_edge
                (&local_578->super_directed_graph_t,*(vertex_index_t *)local_548._M_dataplus._M_p,
                 *(vertex_index_t *)(local_548._M_dataplus._M_p + 2));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_548._M_dataplus._M_p,
                        local_548.field_2._M_allocated_capacity - (long)local_548._M_dataplus._M_p);
      }
      local_570 = 3;
    }
    iVar19 = local_570;
    if (local_570 == 1) {
      sVar20 = 0;
      iVar21 = 0;
      do {
        iVar21 = iVar21 + (uint)(local_528._M_dataplus._M_p[sVar20] == ' ');
        sVar20 = sVar20 + 1;
      } while (local_528._M_string_length != sVar20);
      iVar19 = 2;
      if (iVar21 == 1) goto LAB_0011414e;
    }
    local_4d0.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4d0.super_directed_graph_t._0_8_ = string_to_float;
    local_4d0.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  ::_M_invoke;
    local_4d0.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)std::
                  _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  ::_M_manager;
    local_570 = iVar19;
    split<float>(&local_508,&local_528,' ',
                 (function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_4d0);
    if ((code *)local_4d0.super_directed_graph_t.edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish != (code *)0x0) {
      (*(code *)local_4d0.super_directed_graph_t.edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish)(&local_4d0,&local_4d0,3);
    }
    fVar1 = *local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar2 = local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    fVar22 = *(float *)((long)local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start +
                       ((long)fVar2 >> 0x3f & (long)(fVar2 - 9.223372e+18) | (long)fVar2) * 4);
    fVar3 = *(float *)((long)local_568.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start +
                      ((long)fVar1 >> 0x3f & (long)(fVar1 - 9.223372e+18) | (long)fVar1) * 4);
    if (fVar22 <= fVar3) {
      fVar22 = fVar3;
    }
    if (local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] < fVar22) {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_2b8,vsnprintf,0x3a,"%f",SUB84((double)fVar1,0));
      std::operator+(&local_298,
                     "The flagser file contained an edge filtration that contradicts the vertex filtration, the edge ("
                     ,&local_2b8);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_3f8._M_dataplus._M_p = (pointer)*plVar15;
      psVar17 = (size_type *)(plVar15 + 2);
      if ((size_type *)local_3f8._M_dataplus._M_p == psVar17) {
        local_3f8.field_2._M_allocated_capacity = *psVar17;
        local_3f8.field_2._8_8_ = plVar15[3];
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      }
      else {
        local_3f8.field_2._M_allocated_capacity = *psVar17;
      }
      local_3f8._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_2d8,vsnprintf,0x3a,"%f",
                 SUB84((double)local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[1],0));
      std::operator+(&local_278,&local_3f8,&local_2d8);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_3d8._M_dataplus._M_p = (pointer)*plVar15;
      psVar17 = (size_type *)(plVar15 + 2);
      if ((size_type *)local_3d8._M_dataplus._M_p == psVar17) {
        local_3d8.field_2._M_allocated_capacity = *psVar17;
        local_3d8.field_2._8_8_ = plVar15[3];
        local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      }
      else {
        local_3d8.field_2._M_allocated_capacity = *psVar17;
      }
      local_3d8._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_2f8,vsnprintf,0x3a,"%f",
                 SUB84((double)local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[2],0));
      std::operator+(&local_258,&local_3d8,&local_2f8);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_3b8._M_dataplus._M_p = (pointer)*plVar15;
      psVar17 = (size_type *)(plVar15 + 2);
      if ((size_type *)local_3b8._M_dataplus._M_p == psVar17) {
        local_3b8.field_2._M_allocated_capacity = *psVar17;
        local_3b8.field_2._8_8_ = plVar15[3];
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      }
      else {
        local_3b8.field_2._M_allocated_capacity = *psVar17;
      }
      local_3b8._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      uVar16 = (ulong)*local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_318,vsnprintf,0x3a,"%f",
                 SUB84((double)*(float *)((long)local_568.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                         ((long)(*local_508.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start -
                                                9.223372e+18) & (long)uVar16 >> 0x3f | uVar16) * 4),
                       0));
      std::operator+(&local_390,&local_3b8,&local_318);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_390);
      local_4f0._M_dataplus._M_p = (pointer)*plVar15;
      psVar17 = (size_type *)(plVar15 + 2);
      if ((size_type *)local_4f0._M_dataplus._M_p == psVar17) {
        local_4f0.field_2._M_allocated_capacity = *psVar17;
        local_4f0.field_2._8_8_ = plVar15[3];
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      }
      else {
        local_4f0.field_2._M_allocated_capacity = *psVar17;
      }
      local_4f0._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      uVar16 = (ulong)local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[1];
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_338,vsnprintf,0x3a,"%f",
                 SUB84((double)*(float *)((long)local_568.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                         ((long)(local_508.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[1] -
                                                9.223372e+18) & (long)uVar16 >> 0x3f | uVar16) * 4),
                       0));
      std::operator+(&local_548,&local_4f0,&local_338);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_548);
      local_4d0.super_directed_graph_t._0_8_ = *plVar15;
      pppuVar18 = (pointer **)(plVar15 + 2);
      if ((pointer **)local_4d0.super_directed_graph_t._0_8_ == pppuVar18) {
        local_4d0.super_directed_graph_t.edges.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)*pppuVar18;
        local_4d0.super_directed_graph_t.edges.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)plVar15[3];
        local_4d0.super_directed_graph_t._0_8_ = pppuVar11;
      }
      else {
        local_4d0.super_directed_graph_t.edges.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)*pppuVar18;
      }
      local_4d0.super_directed_graph_t.edges.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)plVar15[1];
      *plVar15 = (long)pppuVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,(string *)&local_4d0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    filtered_directed_graph_t::add_filtered_edge
              (local_578,(vertex_index_t)(int)fVar1,(vertex_index_t)(int)fVar2,
               local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[2]);
    if (local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_508.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  } while( true );
}

Assistant:

filtered_directed_graph_t read_graph_flagser(const std::string filename, const flagser_parameters& params) {
	std::string line;
	filtered_directed_graph_t graph{};
	int current_dimension = 0;
	std::vector<value_t> vertex_filtration;
	HAS_EDGE_FILTRATION has_edge_filtration = HAS_EDGE_FILTRATION::TOO_EARLY_TO_DECIDE;

	std::ifstream input_stream;
	open_file(filename, input_stream);

	while (not input_stream.eof()) {
		getline(input_stream, line);
		line = trim(line);
		if (line.length() == 0) continue;
		if (line[0] == 'd' && line[1] == 'i' && line[2] == 'm') {
			if (line[4] == '1') {
				graph = filtered_directed_graph_t(vertex_filtration, params.directed);
				current_dimension = 1;
				has_edge_filtration = HAS_EDGE_FILTRATION::MAYBE;
			}
			continue;
		}

		if (current_dimension == 0) {
			if (vertex_filtration.empty()) vertex_filtration = split<value_t>(line, ' ', string_to_float);
		} else {
			if (has_edge_filtration == HAS_EDGE_FILTRATION::MAYBE) {
				// If the edge has three components, then there are also filtration values, which we assume to come last
				int number_of_spaces = 0;
				for (auto& iter : line)
					if (iter == ' ') { number_of_spaces++; }
				has_edge_filtration = number_of_spaces == 1 ? HAS_EDGE_FILTRATION::NO : HAS_EDGE_FILTRATION::YES;
			}

			if (has_edge_filtration == NO) {
				std::vector<vertex_index_t> vertices = split<vertex_index_t>(line, ' ', string_to_uint);
				graph.add_edge(vertices[0], vertices[1]);
			} else {
				std::vector<value_t> vertices = split<value_t>(line, ' ', string_to_float);
				if (value_t(vertices[2]) <
				    std::max(vertex_filtration[size_t(vertices[0])], vertex_filtration[size_t(vertices[1])])) {
					std::string err_msg =
					    "The flagser file contained an edge filtration that contradicts the vertex "
					    "filtration, the edge (" +
					    std::to_string(vertices[0]) + ", " + std::to_string(vertices[1]) + ") has filtration value " +
					    std::to_string(vertices[2]) + ", which is lower than min(" +
					    std::to_string(vertex_filtration[size_t(vertices[0])]) + ", " +
					    std::to_string(vertex_filtration[size_t(vertices[1])]) + "), the filtrations of its vertices.";
					throw std::runtime_error(err_msg);
				}
				graph.add_filtered_edge((vertex_index_t)vertices[0], (vertex_index_t)vertices[1], vertices[2]);
			}
		}
	}

	return graph;
}